

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O3

void finddpos(level *lev,coord *cc,xchar xl,xchar yl,xchar xh,xchar yh)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  xchar x;
  char cVar4;
  xchar y;
  
  x = xl;
  if (xl != xh) {
    uVar2 = mt_random();
    x = SUB161(ZEXT416(uVar2) % SEXT816(((long)xh - (long)xl) + 1),0) + xl;
  }
  y = yl;
  if (yl != yh) {
    uVar2 = mt_random();
    y = SUB161(ZEXT416(uVar2) % SEXT816(((long)yh - (long)yl) + 1),0) + yl;
  }
  iVar3 = okdoor(lev,x,y);
  if ((iVar3 == 0) && (x = xl, y = yh, xl <= xh)) {
    do {
      y = yl;
      if (yl <= yh) {
        do {
          iVar3 = okdoor(lev,x,y);
          if (iVar3 != 0) goto LAB_001dab35;
          y = y + '\x01';
        } while (y <= yh);
      }
      x = x + '\x01';
    } while (x <= xh);
    x = xl;
    y = yh;
    cVar4 = xl;
    if (xl <= xh) {
      do {
        if (yl <= yh) {
          y = yl;
          do {
            cVar1 = lev->locations[cVar4][y].typ;
            x = cVar4;
            if ((cVar1 == '\x0f') || (cVar1 == '\x17')) goto LAB_001dab35;
            y = y + '\x01';
          } while (y <= yh);
        }
        cVar4 = cVar4 + '\x01';
        x = xl;
        y = yh;
      } while (cVar4 <= xh);
    }
  }
LAB_001dab35:
  cc->x = x;
  cc->y = y;
  return;
}

Assistant:

static void finddpos(struct level *lev, coord *cc, xchar xl, xchar yl, xchar xh, xchar yh)
{
	xchar x, y;

	x = (xl == xh) ? xl : (xl + rn2(xh-xl+1));
	y = (yl == yh) ? yl : (yl + rn2(yh-yl+1));
	if (okdoor(lev, x, y))
		goto gotit;

	for (x = xl; x <= xh; x++) for(y = yl; y <= yh; y++)
		if (okdoor(lev, x, y))
			goto gotit;

	for (x = xl; x <= xh; x++) for(y = yl; y <= yh; y++)
		if (IS_DOOR(lev->locations[x][y].typ) || lev->locations[x][y].typ == SDOOR)
			goto gotit;
	/* cannot find something reasonable -- strange */
	x = xl;
	y = yh;
gotit:
	cc->x = x;
	cc->y = y;
	return;
}